

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (serializer<toml::type_config> *this,value_type *v)

{
  value_t vVar1;
  bool bVar2;
  undefined8 uVar3;
  basic_value<toml::type_config> *in_RDX;
  long in_RSI;
  string_type *in_RDI;
  string_type *retval;
  basic_value<toml::type_config> *in_stack_fffffffffffff828;
  basic_value<toml::type_config> *this_00;
  source_location *in_stack_fffffffffffff830;
  local_time_format_info *in_stack_fffffffffffff838;
  source_location *in_stack_fffffffffffff840;
  serializer<toml::type_config> *in_stack_fffffffffffff848;
  serialization_error *in_stack_fffffffffffff850;
  allocator<char> *in_stack_fffffffffffff860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff868;
  basic_value<toml::type_config> *in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff8c8;
  indent_char indent_type;
  preserve_comments *in_stack_fffffffffffff8d0;
  serializer<toml::type_config> *in_stack_fffffffffffff8d8;
  string *in_stack_fffffffffffff9b8;
  source_location *in_stack_fffffffffffff9c0;
  string *in_stack_fffffffffffff9c8;
  source_location *in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  source_location *in_stack_fffffffffffffa30;
  offset_datetime_format_info *in_stack_fffffffffffffa38;
  offset_datetime_type *in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa48;
  source_location *in_stack_fffffffffffffb80;
  floating_format_info *in_stack_fffffffffffffb88;
  floating_type in_stack_fffffffffffffb90;
  serializer<toml::type_config> *in_stack_fffffffffffffb98;
  source_location *in_stack_fffffffffffffc60;
  string_format_info *in_stack_fffffffffffffc68;
  string_type *in_stack_fffffffffffffc70;
  serializer<toml::type_config> *in_stack_fffffffffffffc78;
  source_location *in_stack_fffffffffffffe98;
  comment_type *in_stack_fffffffffffffea0;
  array_format_info *in_stack_fffffffffffffea8;
  array_type *in_stack_fffffffffffffeb0;
  serializer<toml::type_config> *in_stack_fffffffffffffeb8;
  source_location *in_stack_ffffffffffffffb0;
  source_location *in_stack_ffffffffffffffb8;
  comment_type *in_stack_ffffffffffffffc0;
  serializer<toml::type_config> *in_stack_ffffffffffffffc8;
  table_type *in_stack_ffffffffffffffd0;
  serializer<toml::type_config> *in_stack_ffffffffffffffd8;
  
  indent_type = (indent_char)((ulong)in_stack_fffffffffffff8c8 >> 0x38);
  vVar1 = basic_value<toml::type_config>::type(in_RDX);
  switch(vVar1) {
  case empty:
    if ((*(byte *)(in_RSI + 0x15) & 1) == 0) goto switchD_0076a368_default;
    string_conv<std::__cxx11::string,5ul>((char (*) [5])in_stack_fffffffffffff828);
    break;
  case boolean:
    basic_value<toml::type_config>::as_boolean(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_boolean_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              (in_stack_fffffffffffff848,&in_stack_fffffffffffff840->is_ok_,
               (boolean_format_info *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case integer:
    basic_value<toml::type_config>::as_integer(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_integer_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              (in_stack_ffffffffffffffc8,(integer_type)in_stack_ffffffffffffffc0,
               (integer_format_info *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case floating:
    basic_value<toml::type_config>::as_floating(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_floating_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               in_stack_fffffffffffffb80);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case string:
    basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_fffffffffffff870);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    basic_value<toml::type_config>::as_string_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               in_stack_fffffffffffffc60);
    source_location::~source_location(in_stack_fffffffffffff830);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff830);
    break;
  case offset_datetime:
    basic_value<toml::type_config>::as_offset_datetime(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_offset_datetime_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              ((serializer<toml::type_config> *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
               in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case local_datetime:
    basic_value<toml::type_config>::as_local_datetime(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_local_datetime_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              ((serializer<toml::type_config> *)in_stack_fffffffffffffa48,
               (local_datetime_type *)in_stack_fffffffffffffa40,
               (local_datetime_format_info *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case local_date:
    basic_value<toml::type_config>::as_local_date(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_local_date_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              ((serializer<toml::type_config> *)in_stack_fffffffffffff9f8,
               (local_date_type *)in_stack_fffffffffffff9f0,
               (local_date_format_info *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case local_time:
    basic_value<toml::type_config>::as_local_time(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_local_time_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              (in_stack_fffffffffffff848,(local_time_type *)in_stack_fffffffffffff840,
               in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case array:
    basic_value<toml::type_config>::as_array(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_array_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::comments(in_RDX);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()[abi_cxx11_
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  case table:
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff840);
    bVar2 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff840);
    if (bVar2) {
      basic_value<toml::type_config>::comments(in_RDX);
      basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff870);
      format_comments_abi_cxx11_(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,indent_type);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff830,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff828);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff830);
    }
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x76aa9e);
    if (!bVar2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff830,(char)((ulong)in_stack_fffffffffffff828 >> 0x38));
    }
    basic_value<toml::type_config>::as_table_abi_cxx11_(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff870);
    basic_value<toml::type_config>::comments(in_RDX);
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    operator()(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (table_format_info *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff830,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff828);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff830);
    source_location::~source_location(in_stack_fffffffffffff830);
    break;
  default:
switchD_0076a368_default:
    uVar3 = __cxa_allocate_exception(0xa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868,in_stack_fffffffffffff860
              );
    basic_value<toml::type_config>::location(in_stack_fffffffffffff828);
    this_00 = (basic_value<toml::type_config> *)&stack0xfffffffffffff9df;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868,in_stack_fffffffffffff860
              );
    format_error<>(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    basic_value<toml::type_config>::location(this_00);
    serialization_error::serialization_error
              (in_stack_fffffffffffff850,(string *)in_stack_fffffffffffff848,
               in_stack_fffffffffffff840);
    __cxa_throw(uVar3,&serialization_error::typeinfo,serialization_error::~serialization_error);
  }
  return in_RDI;
}

Assistant:

string_type operator()(const value_type& v)
    {
        switch(v.type())
        {
            case value_t::boolean        : {return (*this)(v.as_boolean        (), v.as_boolean_fmt        (), v.location());}
            case value_t::integer        : {return (*this)(v.as_integer        (), v.as_integer_fmt        (), v.location());}
            case value_t::floating       : {return (*this)(v.as_floating       (), v.as_floating_fmt       (), v.location());}
            case value_t::string         : {return (*this)(v.as_string         (), v.as_string_fmt         (), v.location());}
            case value_t::offset_datetime: {return (*this)(v.as_offset_datetime(), v.as_offset_datetime_fmt(), v.location());}
            case value_t::local_datetime : {return (*this)(v.as_local_datetime (), v.as_local_datetime_fmt (), v.location());}
            case value_t::local_date     : {return (*this)(v.as_local_date     (), v.as_local_date_fmt     (), v.location());}
            case value_t::local_time     : {return (*this)(v.as_local_time     (), v.as_local_time_fmt     (), v.location());}
            case value_t::array          :
            {
                return (*this)(v.as_array(), v.as_array_fmt(), v.comments(), v.location());
            }
            case value_t::table          :
            {
                string_type retval;
                if(this->keys_.empty()) // it might be the root table. emit comments here.
                {
                    retval += format_comments(v.comments(), v.as_table_fmt().indent_type);
                }
                if( ! retval.empty()) // we have comment.
                {
                    retval += char_type('\n');
                }

                retval += (*this)(v.as_table(), v.as_table_fmt(), v.comments(), v.location());
                return retval;
            }
            case value_t::empty:
            {
                if(this->spec_.ext_null_value)
                {
                    return string_conv<string_type>("null");
                }
                break;
            }
            default:
            {
                break;
            }
        }
        throw serialization_error(format_error(
            "[error] toml::serializer: toml::basic_value "
            "does not have any valid type.", v.location(), "here"), v.location());
    }